

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O1

string * trim(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  string *psVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  _Alloc_hider _Var8;
  ulong *puVar9;
  ulong *puVar10;
  ulong *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  _Alloc_hider local_58;
  ulong local_50;
  ulong local_48;
  undefined8 uStack_40;
  string *local_38;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_78 = (ulong *)&local_68;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar1,pcVar1 + s->_M_string_length)
  ;
  puVar10 = local_78;
  puVar9 = (ulong *)((long)local_78 + local_70);
  puVar6 = puVar9;
  if (0 < local_70 >> 2) {
    puVar6 = (ulong *)((long)local_78 + (ulong)((uint)local_70 & 3));
    lVar7 = (local_70 >> 2) + 1;
    do {
      iVar4 = isspace((int)*(char *)((long)puVar9 + -1));
      if (iVar4 == 0) goto LAB_0010f6c5;
      iVar4 = isspace((int)*(char *)((long)puVar9 + -2));
      if (iVar4 == 0) {
        puVar9 = (ulong *)((long)puVar9 + -1);
        goto LAB_0010f6c5;
      }
      iVar4 = isspace((int)*(char *)((long)puVar9 + -3));
      if (iVar4 == 0) {
        puVar9 = (ulong *)((long)puVar9 + -2);
        goto LAB_0010f6c5;
      }
      iVar4 = isspace((int)*(char *)((long)puVar9 + -4));
      if (iVar4 == 0) {
        puVar9 = (ulong *)((long)puVar9 + -3);
        goto LAB_0010f6c5;
      }
      puVar9 = (ulong *)((long)puVar9 + -4);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)puVar6 - (long)puVar10;
  if (lVar7 == 1) {
LAB_0010f69d:
    iVar4 = isspace((int)*(char *)((long)puVar6 + -1));
    puVar9 = puVar6;
    if (iVar4 != 0) {
      puVar9 = puVar10;
    }
  }
  else {
    puVar9 = puVar6;
    if (lVar7 == 2) {
LAB_0010f68c:
      iVar4 = isspace((int)*(char *)((long)puVar9 + -1));
      if (iVar4 != 0) {
        puVar6 = (ulong *)((long)puVar9 + -1);
        goto LAB_0010f69d;
      }
    }
    else {
      puVar9 = puVar10;
      if ((lVar7 == 3) &&
         (iVar4 = isspace((int)*(char *)((long)puVar6 + -1)), puVar9 = puVar6, iVar4 != 0)) {
        puVar9 = (ulong *)((long)puVar6 + -1);
        goto LAB_0010f68c;
      }
    }
  }
LAB_0010f6c5:
  uVar5 = (long)puVar9 - (long)puVar10;
  *(char *)puVar9 = '\0';
  if (local_78 == (ulong *)&local_68) {
    uStack_40 = uStack_60;
    local_58._M_p = (pointer)&local_48;
  }
  else {
    local_58._M_p = (pointer)local_78;
  }
  _Var2._M_p = local_58._M_p;
  local_48 = CONCAT71(uStack_67,local_68);
  local_70 = 0;
  local_68 = 0;
  puVar9 = (ulong *)(local_58._M_p + uVar5);
  _Var8._M_p = local_58._M_p;
  local_78 = (ulong *)&local_68;
  local_50 = uVar5;
  if (0 < (long)uVar5 >> 2) {
    _Var8._M_p = local_58._M_p + (uVar5 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar5 >> 2) + 1;
    puVar10 = (ulong *)(local_58._M_p + 3);
    do {
      iVar4 = isspace((int)*(char *)((long)puVar10 + -3));
      if (iVar4 == 0) {
        puVar10 = (ulong *)((long)puVar10 + -3);
        goto LAB_0010f7f8;
      }
      iVar4 = isspace((int)*(char *)((long)puVar10 + -2));
      if (iVar4 == 0) {
        puVar10 = (ulong *)((long)puVar10 + -2);
        goto LAB_0010f7f8;
      }
      iVar4 = isspace((int)*(char *)((long)puVar10 + -1));
      if (iVar4 == 0) {
        puVar10 = (ulong *)((long)puVar10 + -1);
        goto LAB_0010f7f8;
      }
      iVar4 = isspace((int)(char)*puVar10);
      if (iVar4 == 0) goto LAB_0010f7f8;
      lVar7 = lVar7 + -1;
      puVar10 = (ulong *)((long)puVar10 + 4);
    } while (1 < lVar7);
  }
  lVar7 = (long)puVar9 - (long)_Var8._M_p;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      puVar10 = puVar9;
      if ((lVar7 != 3) ||
         (iVar4 = isspace((int)(char)*(ulong *)_Var8._M_p), puVar10 = (ulong *)_Var8._M_p,
         iVar4 == 0)) goto LAB_0010f7f8;
      _Var8._M_p = _Var8._M_p + 1;
    }
    iVar4 = isspace((int)(char)*(ulong *)_Var8._M_p);
    puVar10 = (ulong *)_Var8._M_p;
    if (iVar4 == 0) goto LAB_0010f7f8;
    _Var8._M_p = _Var8._M_p + 1;
  }
  iVar4 = isspace((int)(char)*(ulong *)_Var8._M_p);
  puVar10 = (ulong *)_Var8._M_p;
  if (iVar4 != 0) {
    puVar10 = puVar9;
  }
LAB_0010f7f8:
  if (puVar9 == puVar10) {
    local_50 = 0;
    *_Var2._M_p = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)&local_58,0);
  }
  psVar3 = local_38;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  if ((ulong *)local_58._M_p == &local_48) {
    (local_38->field_2)._M_allocated_capacity = local_48;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uStack_40;
  }
  else {
    (local_38->_M_dataplus)._M_p = local_58._M_p;
    (local_38->field_2)._M_allocated_capacity = local_48;
  }
  local_38->_M_string_length = local_50;
  local_50 = 0;
  local_48 = local_48 & 0xffffffffffffff00;
  if (local_78 != (ulong *)&local_68) {
    local_58._M_p = (pointer)&local_48;
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return psVar3;
}

Assistant:

static inline string trim(string s) {
  return ltrim(rtrim(s));
}